

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  int *piVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  ulong uVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  pointer pnVar7;
  undefined8 uVar8;
  int32_t iVar9;
  undefined8 uVar10;
  int iVar11;
  undefined8 *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  int *piVar14;
  long lVar15;
  bool *pbVar16;
  int *piVar17;
  pointer pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  uint *puVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  undefined4 *puVar22;
  uint *puVar23;
  soplex *psVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  undefined4 *puVar26;
  VarStatus VVar27;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar28;
  long in_FS_OFFSET;
  bool bVar29;
  byte bVar30;
  ulong uVar31;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  fpclass_type local_e88;
  undefined1 local_e68 [16];
  undefined1 local_e58 [16];
  undefined1 local_e48 [16];
  undefined1 local_e38 [16];
  undefined1 local_e28 [16];
  undefined1 local_e18 [16];
  uint local_e08 [3];
  undefined3 uStack_dfb;
  int iStack_df8;
  bool abStack_df4 [4];
  ulong local_df0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_de8;
  int local_ddc;
  int *local_dd8;
  undefined8 uStack_dd0;
  cpp_dec_float<200U,_int,_void> *local_dc8;
  undefined8 uStack_dc0;
  cpp_dec_float<200U,_int,_void> *local_db0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_da8;
  cpp_dec_float<200U,_int,_void> *local_da0;
  undefined1 local_d98 [32];
  undefined1 local_d78 [16];
  undefined1 local_d68 [16];
  undefined1 local_d58 [16];
  undefined1 local_d48 [16];
  undefined1 local_d38 [13];
  undefined3 uStack_d2b;
  int iStack_d28;
  bool abStack_d24 [4];
  ulong local_d20;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d18;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d10;
  cpp_dec_float<200U,_int,_void> local_d08;
  cpp_dec_float<200U,_int,_void> local_c88;
  undefined1 local_c08 [32];
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [16];
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [13];
  undefined3 uStack_b9b;
  int iStack_b98;
  bool bStack_b94;
  undefined8 local_b90;
  undefined1 local_b88 [32];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  undefined1 local_b28 [13];
  undefined3 uStack_b1b;
  int iStack_b18;
  bool bStack_b14;
  undefined8 local_b10;
  cpp_dec_float<200U,_int,_void> local_b08;
  undefined1 local_a88 [32];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [13];
  undefined3 uStack_a1b;
  int iStack_a18;
  bool bStack_a14;
  undefined8 local_a10;
  cpp_dec_float<200U,_int,_void> local_a08;
  cpp_dec_float<200U,_int,_void> local_988;
  undefined1 local_908 [32];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [13];
  undefined3 uStack_89b;
  undefined5 uStack_898;
  undefined8 local_890;
  cpp_dec_float<200U,_int,_void> local_880;
  cpp_dec_float<200U,_int,_void> local_800;
  cpp_dec_float<200U,_int,_void> local_780;
  cpp_dec_float<200U,_int,_void> local_700;
  cpp_dec_float<200U,_int,_void> local_680;
  cpp_dec_float<200U,_int,_void> local_600;
  uint local_580 [28];
  uint local_510 [28];
  uint local_4a0 [28];
  uint local_430 [28];
  uint local_3c0 [28];
  uint local_350 [28];
  undefined4 local_2e0 [28];
  undefined4 local_270 [28];
  uint local_200 [28];
  uint local_190 [28];
  undefined4 local_120 [28];
  uint local_b0 [28];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar30 = 0;
  iVar11 = this->m_j;
  iVar6 = this->m_old_j;
  if (iVar11 != iVar6) {
    pnVar7 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar20 = (uint *)(pnVar7 + iVar11);
    puVar23 = (uint *)(pnVar7 + iVar6);
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar23 = *puVar20;
      puVar20 = puVar20 + 1;
      puVar23 = puVar23 + 1;
    }
    pnVar7[iVar6].m_backend.exp = pnVar7[iVar11].m_backend.exp;
    pnVar7[iVar6].m_backend.neg = pnVar7[iVar11].m_backend.neg;
    iVar9 = pnVar7[iVar11].m_backend.prec_elem;
    pnVar7[iVar6].m_backend.fpclass = pnVar7[iVar11].m_backend.fpclass;
    pnVar7[iVar6].m_backend.prec_elem = iVar9;
    iVar11 = this->m_j;
    pnVar7 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = this->m_old_j;
    puVar20 = (uint *)(pnVar7 + iVar11);
    puVar23 = (uint *)(pnVar7 + iVar6);
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar23 = *puVar20;
      puVar20 = puVar20 + 1;
      puVar23 = puVar23 + 1;
    }
    pnVar7[iVar6].m_backend.exp = pnVar7[iVar11].m_backend.exp;
    pnVar7[iVar6].m_backend.neg = pnVar7[iVar11].m_backend.neg;
    iVar9 = pnVar7[iVar11].m_backend.prec_elem;
    pnVar7[iVar6].m_backend.fpclass = pnVar7[iVar11].m_backend.fpclass;
    pnVar7[iVar6].m_backend.prec_elem = iVar9;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_de8 = s;
  local_da8 = x;
  local_d10 = y;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_d08,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar11 = this->m_i;
  pnVar7 = (local_de8->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar18 = pnVar7 + iVar11;
  puVar22 = local_120;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar22 = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
    puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
  }
  iVar6 = pnVar7[iVar11].m_backend.exp;
  bVar29 = pnVar7[iVar11].m_backend.neg;
  uVar8._0_4_ = pnVar7[iVar11].m_backend.fpclass;
  uVar8._4_4_ = pnVar7[iVar11].m_backend.prec_elem;
  uStack_dd0 = 0;
  local_890._0_4_ = cpp_dec_float_finite;
  local_890._4_4_ = 0x1c;
  local_908._0_16_ = (undefined1  [16])0x0;
  local_908._16_16_ = (undefined1  [16])0x0;
  local_8e8 = (undefined1  [16])0x0;
  local_8d8 = (undefined1  [16])0x0;
  local_8c8 = (undefined1  [16])0x0;
  local_8b8 = (undefined1  [16])0x0;
  local_8a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_89b = 0;
  uStack_898._0_4_ = 0;
  uStack_898._4_1_ = false;
  local_dd8 = (int *)uVar8;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_908,1e-06);
  puVar22 = local_120;
  puVar26 = (undefined4 *)local_e68;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar26 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
    puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
  }
  abStack_df4[0] = bVar29;
  if ((bVar29 == true) && (local_e68._0_4_ != 0 || (fpclass_type)local_dd8 != cpp_dec_float_finite))
  {
    abStack_df4[0] = false;
  }
  piVar17 = &this->m_i;
  bVar29 = (fpclass_type)local_dd8 == cpp_dec_float_NaN;
  iStack_df8 = iVar6;
  local_df0 = uVar8;
  local_dd8 = piVar17;
  if (((bVar29) || ((fpclass_type)local_890 == cpp_dec_float_NaN)) ||
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e68,
                          (cpp_dec_float<200U,_int,_void> *)local_908), 0 < iVar11)) {
    pcVar13 = &(local_de8->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*piVar17].m_backend;
    ::soplex::infinity::__tls_init();
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,*(double *)(in_FS_OFFSET + -8));
    if (((pcVar13->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_df0 != cpp_dec_float_NaN))
       && (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar13,(cpp_dec_float<200U,_int,_void> *)local_e68), -1 < iVar11)) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_e68._0_8_ = local_e58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e68,"Simplifier: infinite activities - aborting unsimplification",
                 "");
      *puVar12 = &PTR__SPxException_006a9ee8;
      puVar12[1] = puVar12 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar12 + 1),local_e68._0_8_,
                 (undefined1 *)(local_e68._0_8_ + local_e68._8_8_));
      __cxa_throw(puVar12,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)
               ((local_de8->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *piVar17),0.0);
  }
  iStack_df8 = (this->m_lhs).m_backend.exp;
  abStack_df4[0] = (this->m_lhs).m_backend.neg;
  iVar11 = this->m_i;
  pnVar7 = (local_de8->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_df0._0_4_ = (this->m_lhs).m_backend.fpclass;
  local_df0._4_4_ = (this->m_lhs).m_backend.prec_elem;
  pnVar18 = pnVar7 + iVar11;
  puVar20 = local_3c0;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar20 = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
  }
  iVar6 = pnVar7[iVar11].m_backend.exp;
  bVar29 = pnVar7[iVar11].m_backend.neg;
  uVar31._0_4_ = pnVar7[iVar11].m_backend.fpclass;
  uVar31._4_4_ = pnVar7[iVar11].m_backend.prec_elem;
  pnVar19 = &this->m_lhs;
  puVar20 = (uint *)local_e68;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar20 = (pnVar19->m_backend).data._M_elems[0];
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
  }
  if ((abStack_df4[0] == true) && (local_e68._0_4_ != 0 || (fpclass_type)local_df0 != 0)) {
    abStack_df4[0] = false;
  }
  puVar20 = local_3c0;
  puVar23 = (uint *)local_d98;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar23 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
  }
  iStack_d28 = iVar6;
  abStack_d24[0] = bVar29;
  local_d20 = uVar31;
  if ((bVar29 != false) && (local_d98._0_4_ != 0 || (undefined4)uVar31 != 0)) {
    abStack_d24[0] = (bool)(bVar29 ^ 1);
  }
  bVar29 = false;
  local_d18 = r;
  local_dc8 = &(this->m_lhs).m_backend;
  if (((fpclass_type)local_df0 != 2) && ((undefined4)uVar31 != 2)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_e68,
                        (cpp_dec_float<200U,_int,_void> *)local_d98);
    bVar29 = 0 < iVar11;
  }
  puVar20 = (uint *)local_d98;
  if (bVar29) {
    puVar20 = (uint *)local_e68;
  }
  pcVar13 = &local_b08;
  lVar15 = 0x1c;
  piVar17 = &iStack_d28;
  if (bVar29) {
    piVar17 = &iStack_df8;
  }
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar13->data)._M_elems[0] = *puVar20;
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar30 * -2 + 1) * 4);
  }
  local_b08.exp = *piVar17;
  pbVar16 = abStack_d24;
  if (bVar29) {
    pbVar16 = abStack_df4;
  }
  local_b08.neg = *pbVar16;
  uVar31 = CONCAT44((int)((uint)bVar29 << 0x1f) >> 0x1f,(int)((uint)bVar29 << 0x1f) >> 0x1f);
  uVar31 = ~uVar31 & local_d20 | local_df0 & uVar31;
  local_b08.fpclass = (int)uVar31;
  local_b08.prec_elem = (int)(uVar31 >> 0x20);
  iStack_df8 = (this->m_rhs).m_backend.exp;
  abStack_df4[0] = (this->m_rhs).m_backend.neg;
  iVar11 = this->m_i;
  pnVar7 = (local_de8->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_df0._0_4_ = (this->m_rhs).m_backend.fpclass;
  local_df0._4_4_ = (this->m_rhs).m_backend.prec_elem;
  pnVar18 = pnVar7 + iVar11;
  puVar20 = local_430;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar20 = (pnVar18->m_backend).data._M_elems[0];
    pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
  }
  iVar6 = pnVar7[iVar11].m_backend.exp;
  bVar29 = pnVar7[iVar11].m_backend.neg;
  uVar3._0_4_ = pnVar7[iVar11].m_backend.fpclass;
  uVar3._4_4_ = pnVar7[iVar11].m_backend.prec_elem;
  pnVar19 = &this->m_rhs;
  puVar20 = (uint *)local_e68;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar20 = (pnVar19->m_backend).data._M_elems[0];
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
  }
  if ((abStack_df4[0] == true) && (local_e68._0_4_ != 0 || (fpclass_type)local_df0 != 0)) {
    abStack_df4[0] = false;
  }
  puVar20 = local_430;
  puVar23 = (uint *)local_d98;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar23 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
  }
  iStack_d28 = iVar6;
  abStack_d24[0] = bVar29;
  local_d20 = uVar3;
  if ((bVar29 != false) && (local_d98._0_4_ != 0 || (undefined4)uVar3 != 0)) {
    abStack_d24[0] = (bool)(bVar29 ^ 1);
  }
  bVar29 = false;
  if (((fpclass_type)local_df0 != 2) && ((undefined4)uVar3 != 2)) {
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)local_e68,
                        (cpp_dec_float<200U,_int,_void> *)local_d98);
    bVar29 = 0 < iVar11;
  }
  puVar20 = (uint *)local_d98;
  if (bVar29) {
    puVar20 = (uint *)local_e68;
  }
  pcVar13 = &local_c88;
  lVar15 = 0x1c;
  piVar17 = &iStack_d28;
  if (bVar29) {
    piVar17 = &iStack_df8;
  }
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar13->data)._M_elems[0] = *puVar20;
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar30 * -2 + 1) * 4);
  }
  pbVar16 = abStack_d24;
  if (bVar29) {
    pbVar16 = abStack_df4;
  }
  local_c88.exp = *piVar17;
  local_c88.neg = *pbVar16;
  uVar31 = CONCAT44((int)((uint)bVar29 << 0x1f) >> 0x1f,(int)((uint)bVar29 << 0x1f) >> 0x1f);
  local_c88._120_8_ = ~uVar31 & local_d20 | local_df0 & uVar31;
  if (local_b08.fpclass != cpp_dec_float_NaN) {
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,1.0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_b08,(cpp_dec_float<200U,_int,_void> *)local_e68);
    if (iVar11 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_b08,1.0);
    }
  }
  pcVar13 = local_dc8;
  if (local_c88.fpclass != cpp_dec_float_NaN) {
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,1.0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_c88,(cpp_dec_float<200U,_int,_void> *)local_e68);
    if (iVar11 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_c88,1.0);
    }
  }
  local_df0._0_4_ = cpp_dec_float_finite;
  local_df0._4_4_ = 0x1c;
  local_e68 = (undefined1  [16])0x0;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08[0] = 0;
  local_e08[1] = 0;
  stack0xfffffffffffff200 = 0;
  uStack_dfb = 0;
  iStack_df8 = 0;
  abStack_df4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_e68,pcVar13,&local_b08);
  pVVar28 = local_de8;
  local_d20._0_4_ = cpp_dec_float_finite;
  local_d20._4_4_ = 0x1c;
  local_d98._0_16_ = (undefined1  [16])0x0;
  local_d98._16_16_ = (undefined1  [16])0x0;
  local_d78 = (undefined1  [16])0x0;
  local_d68 = (undefined1  [16])0x0;
  local_d58 = (undefined1  [16])0x0;
  local_d48 = (undefined1  [16])0x0;
  local_d38 = SUB1613((undefined1  [16])0x0,0);
  uStack_d2b = 0;
  iStack_d28 = 0;
  abStack_d24[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_d98,
             &(local_de8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&local_b08);
  local_988.fpclass = cpp_dec_float_finite;
  local_988.prec_elem = 0x1c;
  local_988.exp = 0;
  local_988.neg = false;
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e68;
  pcVar21 = &local_988;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar21->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar30 * -8 + 4);
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar30 * -8 + 4);
  }
  local_988.exp = iStack_df8;
  local_988.neg = abStack_df4[0];
  local_988.fpclass = (fpclass_type)local_df0;
  local_988.prec_elem = local_df0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_988,(cpp_dec_float<200U,_int,_void> *)local_d98);
  local_df0._0_4_ = cpp_dec_float_finite;
  local_df0._4_4_ = 0x1c;
  local_e68 = (undefined1  [16])0x0;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08[0] = 0;
  local_e08[1] = 0;
  stack0xfffffffffffff200 = 0;
  uStack_dfb = 0;
  iStack_df8 = 0;
  abStack_df4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_e68,&(this->m_rhs).m_backend,&local_c88);
  local_d20._0_4_ = cpp_dec_float_finite;
  local_d20._4_4_ = 0x1c;
  local_d98._0_16_ = (undefined1  [16])0x0;
  local_d98._16_16_ = (undefined1  [16])0x0;
  local_d78 = (undefined1  [16])0x0;
  local_d68 = (undefined1  [16])0x0;
  local_d58 = (undefined1  [16])0x0;
  local_d48 = (undefined1  [16])0x0;
  local_d38 = SUB1613((undefined1  [16])0x0,0);
  uStack_d2b = 0;
  iStack_d28 = 0;
  abStack_d24[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_d98,
             &(pVVar28->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&local_c88);
  local_a08.fpclass = cpp_dec_float_finite;
  local_a08.prec_elem = 0x1c;
  local_a08.exp = 0;
  local_a08.neg = false;
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e68;
  pcVar21 = &local_a08;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar21->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar30 * -8 + 4);
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar30 * -8 + 4);
  }
  local_a08.exp = iStack_df8;
  local_a08.neg = abStack_df4[0];
  local_a08.fpclass = (fpclass_type)local_df0;
  local_a08.prec_elem = local_df0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&local_a08,(cpp_dec_float<200U,_int,_void> *)local_d98);
  uVar8 = local_988._120_8_;
  bVar29 = local_988.neg;
  iVar11 = local_988.exp;
  pcVar13 = &local_988;
  puVar20 = local_190;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar20 = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar30 * -8 + 4);
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_680,this);
  puVar20 = local_190;
  puVar23 = (uint *)local_e68;
  for (lVar15 = 0x1c; uVar10 = local_988._120_8_, lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar23 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
  }
  iStack_df8 = iVar11;
  abStack_df4[0] = bVar29;
  local_988.fpclass = (fpclass_type)uVar8;
  local_988.prec_elem = SUB84(uVar8,4);
  local_df0._0_4_ = local_988.fpclass;
  local_df0._4_4_ = local_988.prec_elem;
  local_e88 = (fpclass_type)uVar8;
  if ((bVar29 == true) && (local_e68._0_4_ != 0 || local_e88 != cpp_dec_float_finite)) {
    abStack_df4[0] = false;
  }
  local_988._120_8_ = uVar10;
  if (((local_e88 != cpp_dec_float_NaN) && (local_680.fpclass != cpp_dec_float_NaN)) &&
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e68,&local_680), iVar11 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_988,0.0);
  }
  uVar8 = local_a08._120_8_;
  bVar29 = local_a08.neg;
  iVar11 = local_a08.exp;
  pcVar13 = &local_a08;
  puVar20 = local_200;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar20 = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar30 * -2 + 1) * 4);
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_700);
  puVar20 = local_200;
  puVar23 = (uint *)local_e68;
  for (lVar15 = 0x1c; uVar10 = local_a08._120_8_, lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar23 = *puVar20;
    puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
  }
  iStack_df8 = iVar11;
  abStack_df4[0] = bVar29;
  local_a08.fpclass = (fpclass_type)uVar8;
  local_a08.prec_elem = SUB84(uVar8,4);
  local_df0._0_4_ = local_a08.fpclass;
  local_df0._4_4_ = local_a08.prec_elem;
  local_e88 = (fpclass_type)uVar8;
  if ((bVar29 == true) && (local_e68._0_4_ != 0 || local_e88 != cpp_dec_float_finite)) {
    abStack_df4[0] = false;
  }
  local_a08._120_8_ = uVar10;
  if (((local_e88 != cpp_dec_float_NaN) && (local_700.fpclass != cpp_dec_float_NaN)) &&
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e68,&local_700), iVar11 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_a08,0.0);
  }
  if (local_d08.fpclass == cpp_dec_float_NaN) {
LAB_00586192:
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_d98;
    local_d20._0_4_ = cpp_dec_float_finite;
    local_d20._4_4_ = 0x1c;
    iStack_d28 = 0;
    abStack_d24[0] = false;
    pcVar21 = &local_a08;
    pcVar25 = pcVar13;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar30 * -2 + 1) * 4);
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4);
    }
    iStack_d28 = local_a08.exp;
    abStack_d24[0] = local_a08.neg;
    local_d20._0_4_ = local_a08.fpclass;
    local_d20._4_4_ = local_a08.prec_elem;
    pcVar21 = &local_c88;
  }
  else {
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e68;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (pcVar13,0,(type *)0x0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_d08,pcVar13);
    if (iVar11 < 1) goto LAB_00586192;
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    pcVar21 = &local_988;
    pcVar25 = pcVar13;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar30 * -2 + 1) * 4);
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4);
    }
    iStack_df8 = local_988.exp;
    abStack_df4[0] = local_988.neg;
    local_df0._0_4_ = local_988.fpclass;
    local_df0._4_4_ = local_988.prec_elem;
    pcVar21 = &local_b08;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(pcVar13,pcVar21);
  local_b10._0_4_ = cpp_dec_float_finite;
  local_b10._4_4_ = 0x1c;
  local_b88._0_16_ = (undefined1  [16])0x0;
  local_b88._16_16_ = (undefined1  [16])0x0;
  local_b68 = (undefined1  [16])0x0;
  local_b58 = (undefined1  [16])0x0;
  local_b48 = (undefined1  [16])0x0;
  local_b38 = (undefined1  [16])0x0;
  local_b28 = SUB1613((undefined1  [16])0x0,0);
  uStack_b1b = 0;
  iStack_b18 = 0;
  bStack_b14 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_b88,pcVar13,&local_d08);
  if (local_d08.fpclass == cpp_dec_float_NaN) {
LAB_005862b5:
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_d98;
    local_d20._0_4_ = cpp_dec_float_finite;
    local_d20._4_4_ = 0x1c;
    iStack_d28 = 0;
    abStack_d24[0] = false;
    pcVar21 = &local_988;
    pcVar25 = pcVar13;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar30 * -2 + 1) * 4);
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4);
    }
    iStack_d28 = local_988.exp;
    abStack_d24[0] = local_988.neg;
    local_d20._0_4_ = local_988.fpclass;
    local_d20._4_4_ = local_988.prec_elem;
    pcVar21 = &local_b08;
  }
  else {
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e68;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              (pcVar13,0,(type *)0x0);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&local_d08,pcVar13);
    if (iVar11 < 1) goto LAB_005862b5;
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    pcVar21 = &local_a08;
    pcVar25 = pcVar13;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar25->data)._M_elems[0] = (pcVar21->data)._M_elems[0];
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar30 * -2 + 1) * 4);
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4);
    }
    iStack_df8 = local_a08.exp;
    abStack_df4[0] = local_a08.neg;
    local_df0._0_4_ = local_a08.fpclass;
    local_df0._4_4_ = local_a08.prec_elem;
    pcVar21 = &local_c88;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(pcVar13,pcVar21);
  local_b90._0_4_ = cpp_dec_float_finite;
  local_b90._4_4_ = 0x1c;
  local_c08._0_16_ = (undefined1  [16])0x0;
  local_c08._16_16_ = (undefined1  [16])0x0;
  local_be8 = (undefined1  [16])0x0;
  local_bd8 = (undefined1  [16])0x0;
  local_bc8 = (undefined1  [16])0x0;
  local_bb8 = (undefined1  [16])0x0;
  local_ba8 = SUB1613((undefined1  [16])0x0,0);
  uStack_b9b = 0;
  iStack_b98 = 0;
  bStack_b94 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_c08,pcVar13,&local_d08);
  uVar8 = local_b10;
  bVar29 = bStack_b14;
  iVar11 = iStack_b18;
  puVar22 = (undefined4 *)local_b88;
  puVar26 = local_270;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar26 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
    puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_780);
  puVar22 = local_270;
  puVar26 = (undefined4 *)local_e68;
  for (lVar15 = 0x1c; uVar10 = local_b10, lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar26 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
    puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
  }
  iStack_df8 = iVar11;
  abStack_df4[0] = bVar29;
  local_b10._0_4_ = (fpclass_type)uVar8;
  local_b10._4_4_ = SUB84(uVar8,4);
  local_df0._0_4_ = (fpclass_type)local_b10;
  local_df0._4_4_ = local_b10._4_4_;
  local_e88 = (fpclass_type)uVar8;
  if ((bVar29 == true) && (local_e68._0_4_ != 0 || local_e88 != cpp_dec_float_finite)) {
    abStack_df4[0] = false;
  }
  local_b10 = uVar10;
  if (((local_e88 != cpp_dec_float_NaN) && (local_780.fpclass != cpp_dec_float_NaN)) &&
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e68,&local_780), iVar11 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_b88,0.0);
  }
  uVar8 = local_b90;
  bVar29 = bStack_b94;
  iVar11 = iStack_b98;
  puVar22 = (undefined4 *)local_c08;
  puVar26 = local_2e0;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar26 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
    puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
  }
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_800);
  puVar22 = local_2e0;
  puVar26 = (undefined4 *)local_e68;
  for (lVar15 = 0x1c; uVar10 = local_b90, pVVar28 = local_da8, lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar26 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
    puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
  }
  iStack_df8 = iVar11;
  abStack_df4[0] = bVar29;
  local_b90._0_4_ = (fpclass_type)uVar8;
  local_b90._4_4_ = SUB84(uVar8,4);
  local_df0._0_4_ = (fpclass_type)local_b90;
  local_df0._4_4_ = local_b90._4_4_;
  local_e88 = (fpclass_type)uVar8;
  if ((bVar29 == true) && (local_e68._0_4_ != 0 || local_e88 != cpp_dec_float_finite)) {
    abStack_df4[0] = false;
  }
  piVar17 = local_dd8;
  local_b90 = uVar10;
  if (((local_e88 != cpp_dec_float_NaN) && (local_800.fpclass != cpp_dec_float_NaN)) &&
     (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_e68,&local_800),
     piVar17 = local_dd8, iVar11 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_c08,0.0);
  }
  uVar8 = local_b10;
  bVar29 = bStack_b14;
  local_dc8 = (cpp_dec_float<200U,_int,_void> *)rStatus;
  if (BASIC < rStatus->data[*piVar17]) {
switchD_0058652d_caseD_3:
    puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_e68._0_8_ = local_e58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e68,"XMAISM04 This should never happen.","");
    *puVar12 = &PTR__SPxException_006a9ee8;
    puVar12[1] = puVar12 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 1),local_e68._0_8_,
               (undefined1 *)(local_e68._0_8_ + local_e68._8_8_));
    *puVar12 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  piVar1 = &this->m_j;
  switch(rStatus->data[*piVar17]) {
  case ON_UPPER:
    ::soplex::infinity::__tls_init();
    pnVar19 = &this->m_lower;
    local_dd8 = *(int **)(in_FS_OFFSET + -8);
    uStack_dd0 = 0;
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,-(double)local_dd8);
    if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_df0 != cpp_dec_float_NaN)) &&
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar19->m_backend,(cpp_dec_float<200U,_int,_void> *)local_e68),
       iVar11 < 1)) {
      ::soplex::infinity::__tls_init();
      local_d20._0_4_ = cpp_dec_float_finite;
      local_d20._4_4_ = 0x1c;
      local_d98._0_16_ = (undefined1  [16])0x0;
      local_d98._16_16_ = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = (undefined1  [16])0x0;
      local_d48 = (undefined1  [16])0x0;
      local_d38 = SUB1613((undefined1  [16])0x0,0);
      uStack_d2b = 0;
      iStack_d28 = 0;
      abStack_d24[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d98,(double)local_dd8);
      if ((((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_d20 != cpp_dec_float_NaN)) &&
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&(this->m_upper).m_backend,(cpp_dec_float<200U,_int,_void> *)local_d98
                             ), -1 < iVar11)) {
LAB_00587419:
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)
                   ((pVVar28->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *piVar1),0.0);
        VVar27 = ZERO;
        break;
      }
    }
    if ((((this->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
        ((this->m_upper).m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar19->m_backend,&(this->m_upper).m_backend), iVar11 != 0)) {
      if (local_d08.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e68,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d08,(cpp_dec_float<200U,_int,_void> *)local_e68);
        if (0 < iVar11) {
          iVar11 = this->m_j;
          pnVar7 = (pVVar28->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar18 = pnVar7 + iVar11;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
            pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
          }
          pnVar7[iVar11].m_backend.exp = (this->m_lower).m_backend.exp;
          pnVar7[iVar11].m_backend.neg = (this->m_lower).m_backend.neg;
          iVar9 = (this->m_lower).m_backend.prec_elem;
          pnVar7[iVar11].m_backend.fpclass = (this->m_lower).m_backend.fpclass;
          pnVar7[iVar11].m_backend.prec_elem = iVar9;
          VVar27 = ON_LOWER;
          break;
        }
      }
      if (local_d08.fpclass == cpp_dec_float_NaN) {
LAB_00587888:
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_e68._0_8_ = local_e58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e68,"XMAISM02 This should never happen.","");
        *puVar12 = &PTR__SPxException_006a9ee8;
        puVar12[1] = puVar12 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar12 + 1),local_e68._0_8_,
                   (undefined1 *)(local_e68._0_8_ + local_e68._8_8_));
        *puVar12 = &PTR__SPxException_006a9ec0;
        __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      VVar27 = ON_UPPER;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<200U,_int,_void> *)local_e68,0,(type *)0x0);
      iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&local_d08,(cpp_dec_float<200U,_int,_void> *)local_e68);
      if (-1 < iVar11) goto LAB_00587888;
      iVar11 = this->m_j;
      pnVar7 = (pVVar28->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar19 = &this->m_upper;
      pnVar18 = pnVar7 + iVar11;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar7[iVar11].m_backend.exp = (this->m_upper).m_backend.exp;
      pnVar7[iVar11].m_backend.neg = (this->m_upper).m_backend.neg;
      iVar9 = (this->m_upper).m_backend.prec_elem;
      pnVar7[iVar11].m_backend.fpclass = (this->m_upper).m_backend.fpclass;
      pnVar7[iVar11].m_backend.prec_elem = iVar9;
    }
    else {
      iVar11 = this->m_j;
      pnVar7 = (pVVar28->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar18 = pnVar7 + iVar11;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar7[iVar11].m_backend.exp = (this->m_lower).m_backend.exp;
      pnVar7[iVar11].m_backend.neg = (this->m_lower).m_backend.neg;
      iVar9 = (this->m_lower).m_backend.prec_elem;
      pnVar7[iVar11].m_backend.fpclass = (this->m_lower).m_backend.fpclass;
      pnVar7[iVar11].m_backend.prec_elem = iVar9;
      VVar27 = FIXED;
    }
    break;
  case ON_LOWER:
    ::soplex::infinity::__tls_init();
    pnVar19 = &this->m_lower;
    local_dc8 = *(cpp_dec_float<200U,_int,_void> **)(in_FS_OFFSET + -8);
    uStack_dc0 = 0;
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,-(double)local_dc8);
    if ((((this->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
        ((fpclass_type)local_df0 == cpp_dec_float_NaN)) ||
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar19->m_backend,(cpp_dec_float<200U,_int,_void> *)local_e68),
       0 < iVar11)) {
LAB_00586acd:
      if ((((this->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
          ((this->m_upper).m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&pnVar19->m_backend,&(this->m_upper).m_backend), iVar11 != 0)) {
        if (local_d08.fpclass != cpp_dec_float_NaN) {
          VVar27 = ON_UPPER;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_e68,0,(type *)0x0);
          iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_d08,(cpp_dec_float<200U,_int,_void> *)local_e68);
          if (0 < iVar11) {
            iVar11 = this->m_j;
            pnVar7 = (pVVar28->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar19 = &this->m_upper;
            pnVar18 = pnVar7 + iVar11;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
              pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            pnVar7[iVar11].m_backend.exp = (this->m_upper).m_backend.exp;
            pnVar7[iVar11].m_backend.neg = (this->m_upper).m_backend.neg;
            iVar9 = (this->m_upper).m_backend.prec_elem;
            pnVar7[iVar11].m_backend.fpclass = (this->m_upper).m_backend.fpclass;
            pnVar7[iVar11].m_backend.prec_elem = iVar9;
            goto LAB_0058749a;
          }
        }
        if (local_d08.fpclass == cpp_dec_float_NaN) {
LAB_00587805:
          puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_e68._0_8_ = local_e58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e68,"XMAISM01 This should never happen.","");
          *puVar12 = &PTR__SPxException_006a9ee8;
          puVar12[1] = puVar12 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar12 + 1),local_e68._0_8_,
                     (undefined1 *)(local_e68._0_8_ + local_e68._8_8_));
          *puVar12 = &PTR__SPxException_006a9ec0;
          __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e68,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d08,(cpp_dec_float<200U,_int,_void> *)local_e68);
        if (-1 < iVar11) goto LAB_00587805;
        iVar11 = this->m_j;
        pnVar7 = (pVVar28->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar18 = pnVar7 + iVar11;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        pnVar7[iVar11].m_backend.exp = (this->m_lower).m_backend.exp;
        pnVar7[iVar11].m_backend.neg = (this->m_lower).m_backend.neg;
        iVar9 = (this->m_lower).m_backend.prec_elem;
        pnVar7[iVar11].m_backend.fpclass = (this->m_lower).m_backend.fpclass;
        pnVar7[iVar11].m_backend.prec_elem = iVar9;
        VVar27 = ON_LOWER;
      }
      else {
        iVar11 = this->m_j;
        pnVar7 = (pVVar28->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar18 = pnVar7 + iVar11;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        pnVar7[iVar11].m_backend.exp = (this->m_lower).m_backend.exp;
        pnVar7[iVar11].m_backend.neg = (this->m_lower).m_backend.neg;
        iVar9 = (this->m_lower).m_backend.prec_elem;
        pnVar7[iVar11].m_backend.fpclass = (this->m_lower).m_backend.fpclass;
        pnVar7[iVar11].m_backend.prec_elem = iVar9;
        VVar27 = FIXED;
      }
    }
    else {
      ::soplex::infinity::__tls_init();
      local_d20._0_4_ = cpp_dec_float_finite;
      local_d20._4_4_ = 0x1c;
      local_d98._0_16_ = (undefined1  [16])0x0;
      local_d98._16_16_ = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = (undefined1  [16])0x0;
      local_d48 = (undefined1  [16])0x0;
      local_d38 = SUB1613((undefined1  [16])0x0,0);
      uStack_d2b = 0;
      iStack_d28 = 0;
      abStack_d24[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d98,(double)local_dc8);
      if ((((this->m_upper).m_backend.fpclass == cpp_dec_float_NaN) ||
          ((fpclass_type)local_d20 == cpp_dec_float_NaN)) ||
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&(this->m_upper).m_backend,(cpp_dec_float<200U,_int,_void> *)local_d98
                             ), iVar11 < 0)) goto LAB_00586acd;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)
                 ((pVVar28->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + *piVar1),0.0);
      VVar27 = ZERO;
    }
LAB_0058749a:
    piVar14 = piVar1;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)&cStatus->data;
    piVar17 = local_dd8;
    goto LAB_005874f9;
  case FIXED:
    ::soplex::infinity::__tls_init();
    pnVar19 = &this->m_lower;
    dVar4 = *(double *)(in_FS_OFFSET + -8);
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,-dVar4);
    if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_df0 != cpp_dec_float_NaN)) &&
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&pnVar19->m_backend,(cpp_dec_float<200U,_int,_void> *)local_e68),
       iVar11 < 1)) {
      ::soplex::infinity::__tls_init();
      local_d20._0_4_ = cpp_dec_float_finite;
      local_d20._4_4_ = 0x1c;
      local_d98._0_16_ = (undefined1  [16])0x0;
      local_d98._16_16_ = (undefined1  [16])0x0;
      local_d78 = (undefined1  [16])0x0;
      local_d68 = (undefined1  [16])0x0;
      local_d58 = (undefined1  [16])0x0;
      local_d48 = (undefined1  [16])0x0;
      local_d38 = SUB1613((undefined1  [16])0x0,0);
      uStack_d2b = 0;
      iStack_d28 = 0;
      abStack_d24[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_d98,dVar4);
      if ((((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_d20 != cpp_dec_float_NaN)) &&
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&(this->m_upper).m_backend,(cpp_dec_float<200U,_int,_void> *)local_d98
                             ), -1 < iVar11)) goto LAB_00587419;
    }
    pnVar2 = &this->m_upper;
    local_a10._0_4_ = cpp_dec_float_finite;
    local_a10._4_4_ = 0x1c;
    local_a88._0_16_ = (undefined1  [16])0x0;
    local_a88._16_16_ = (undefined1  [16])0x0;
    local_a68 = (undefined1  [16])0x0;
    local_a58 = (undefined1  [16])0x0;
    local_a48 = (undefined1  [16])0x0;
    local_a38 = (undefined1  [16])0x0;
    local_a28 = SUB1613((undefined1  [16])0x0,0);
    uStack_a1b = 0;
    iStack_a18 = 0;
    bStack_a14 = false;
    pcVar13 = &pnVar19->m_backend;
    if (((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_a88 != pnVar2) &&
       (pcVar13 = &pnVar2->m_backend,
       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *)local_a88 != pnVar19)) {
      puVar20 = (uint *)local_a88;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar20 = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
        puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      }
      iStack_a18 = (this->m_lower).m_backend.exp;
      bStack_a14 = (this->m_lower).m_backend.neg;
      local_a10._0_4_ = (this->m_lower).m_backend.fpclass;
      local_a10._4_4_ = (this->m_lower).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              ((cpp_dec_float<200U,_int,_void> *)local_a88,pcVar13);
    local_d20._0_4_ = cpp_dec_float_finite;
    local_d20._4_4_ = 0x1c;
    local_d98._0_16_ = (undefined1  [16])0x0;
    local_d98._16_16_ = (undefined1  [16])0x0;
    local_d78 = (undefined1  [16])0x0;
    local_d68 = (undefined1  [16])0x0;
    local_d58 = (undefined1  [16])0x0;
    local_d48 = (undefined1  [16])0x0;
    local_d38 = SUB1613((undefined1  [16])0x0,0);
    uStack_d2b = 0;
    iStack_d28 = 0;
    abStack_d24[0] = false;
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)local_d98,
               (cpp_dec_float<200U,_int,_void> *)local_a88,
               (cpp_dec_float<200U,_int,_void> *)local_e68);
    iVar11 = *piVar1;
    pnVar7 = (pVVar28->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_d98;
    pnVar18 = pnVar7 + iVar11;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar30 * -8 + 4);
      pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    pnVar7[iVar11].m_backend.exp = iStack_d28;
    pnVar7[iVar11].m_backend.neg = abStack_d24[0];
    pnVar7[iVar11].m_backend.fpclass = (fpclass_type)local_d20;
    pnVar7[iVar11].m_backend.prec_elem = local_d20._4_4_;
    VVar27 = FIXED;
    break;
  case ZERO:
    goto switchD_0058652d_caseD_3;
  case BASIC:
    local_db0 = &(this->m_lower).m_backend;
    pnVar19 = &this->m_lower;
    puVar20 = local_4a0;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar20 = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    }
    local_ddc = (this->m_lower).m_backend.exp;
    bVar5 = (this->m_lower).m_backend.neg;
    puVar20 = (uint *)local_b88;
    puVar23 = local_350;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar23 = *puVar20;
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
    }
    local_da0 = (cpp_dec_float<200U,_int,_void> *)CONCAT44(local_da0._4_4_,iStack_b18);
    (*(this->super_PostStep)._vptr_PostStep[6])(local_b0);
    puVar20 = local_4a0;
    psVar24 = (soplex *)local_d98;
    for (lVar15 = 0x1c; uVar10 = local_b10, lVar15 != 0; lVar15 = lVar15 + -1) {
      *(uint *)psVar24 = *puVar20;
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      psVar24 = psVar24 + (ulong)bVar30 * -8 + 4;
    }
    iStack_d28 = local_ddc;
    abStack_d24[0] = bVar5;
    local_d20._0_4_ = (this->m_lower).m_backend.fpclass;
    local_d20._4_4_ = (this->m_lower).m_backend.prec_elem;
    puVar20 = local_350;
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_a88;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *puVar20;
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    iStack_a18 = (int)local_da0;
    bStack_a14 = bVar29;
    local_b10._0_4_ = (fpclass_type)uVar8;
    local_b10._4_4_ = SUB84(uVar8,4);
    local_a10._0_4_ = (fpclass_type)local_b10;
    local_a10._4_4_ = local_b10._4_4_;
    local_b10 = uVar10;
    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_e68,(soplex *)local_d98,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a88,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((ulong)local_da0 & 0xffffffff));
    pVVar28 = local_da8;
    puVar20 = local_b0;
    pcVar13 = &local_600;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pcVar13->data)._M_elems[0] = *puVar20;
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    local_600.exp = local_40;
    local_600.neg = (bool)local_3c;
    local_600.fpclass = local_38;
    local_600.prec_elem = iStack_34;
    if (local_600.data._M_elems[0] != 0 || (fpclass_type)_local_38 != cpp_dec_float_finite) {
      local_600.neg = (bool)(local_3c ^ 1);
    }
    if ((((fpclass_type)_local_38 != cpp_dec_float_NaN) &&
        ((fpclass_type)local_df0 != cpp_dec_float_NaN)) &&
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_e68,&local_600), 0 < iVar11)) {
      ::soplex::infinity::__tls_init();
      local_df0._0_4_ = cpp_dec_float_finite;
      local_df0._4_4_ = 0x1c;
      local_e68 = (undefined1  [16])0x0;
      local_e58 = (undefined1  [16])0x0;
      local_e48 = (undefined1  [16])0x0;
      local_e38 = (undefined1  [16])0x0;
      local_e28 = (undefined1  [16])0x0;
      local_e18 = (undefined1  [16])0x0;
      local_e08[0] = 0;
      local_e08[1] = 0;
      stack0xfffffffffffff200 = 0;
      uStack_dfb = 0;
      iStack_df8 = 0;
      abStack_df4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_e68,
                 (double)(*(ulong *)(in_FS_OFFSET + -8) ^ (ulong)DAT_00601010));
      if ((((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_df0 != cpp_dec_float_NaN)) &&
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_db0,(cpp_dec_float<200U,_int,_void> *)local_e68),
         piVar17 = local_dd8, 0 < iVar11)) {
        iVar11 = this->m_j;
        pnVar7 = (pVVar28->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar13 = local_db0;
        pnVar18 = pnVar7 + iVar11;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar30 * -8 + 4);
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        pnVar7[iVar11].m_backend.exp = (this->m_lower).m_backend.exp;
        pnVar7[iVar11].m_backend.neg = (this->m_lower).m_backend.neg;
        iVar9 = (this->m_lower).m_backend.prec_elem;
        pnVar7[iVar11].m_backend.fpclass = (this->m_lower).m_backend.fpclass;
        pnVar7[iVar11].m_backend.prec_elem = iVar9;
        VVar27 = ON_LOWER;
        if (((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
           ((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_db0,&(this->m_upper).m_backend);
          VVar27 = (iVar11 == 0) + ON_LOWER;
        }
        break;
      }
    }
    uVar8 = local_b90;
    bVar29 = bStack_b94;
    iVar11 = iStack_b98;
    local_da0 = &(this->m_upper).m_backend;
    pnVar19 = &this->m_upper;
    puVar20 = local_510;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar20 = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar30 * -8 + 4);
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
    }
    local_ddc = (this->m_upper).m_backend.exp;
    bVar5 = (this->m_upper).m_backend.neg;
    puVar20 = (uint *)local_c08;
    puVar23 = local_580;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar23 = *puVar20;
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      puVar23 = puVar23 + (ulong)bVar30 * -2 + 1;
    }
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_880,this);
    puVar20 = local_510;
    psVar24 = (soplex *)local_d98;
    for (lVar15 = 0x1c; uVar10 = local_b90, lVar15 != 0; lVar15 = lVar15 + -1) {
      *(uint *)psVar24 = *puVar20;
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      psVar24 = psVar24 + (ulong)bVar30 * -8 + 4;
    }
    iStack_d28 = local_ddc;
    abStack_d24[0] = bVar5;
    local_d20._0_4_ = (this->m_upper).m_backend.fpclass;
    local_d20._4_4_ = (this->m_upper).m_backend.prec_elem;
    puVar20 = local_580;
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_a88;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = *puVar20;
      puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    iStack_a18 = iVar11;
    bStack_a14 = bVar29;
    local_b90._0_4_ = (fpclass_type)uVar8;
    local_b90._4_4_ = SUB84(uVar8,4);
    local_a10._0_4_ = (fpclass_type)local_b90;
    local_a10._4_4_ = local_b90._4_4_;
    local_b90 = uVar10;
    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_e68,(soplex *)local_d98,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_a88,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)0x0);
    piVar14 = local_dd8;
    pVVar28 = local_da8;
    if ((((fpclass_type)local_df0 != cpp_dec_float_NaN) && (local_880.fpclass != cpp_dec_float_NaN))
       && (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_e68,&local_880),
          pVVar28 = local_da8, piVar17 = local_dd8, piVar14 = piVar17, iVar11 < 1)) {
      ::soplex::infinity::__tls_init();
      local_df0._0_4_ = cpp_dec_float_finite;
      local_df0._4_4_ = 0x1c;
      local_e68 = (undefined1  [16])0x0;
      local_e58 = (undefined1  [16])0x0;
      local_e48 = (undefined1  [16])0x0;
      local_e38 = (undefined1  [16])0x0;
      local_e28 = (undefined1  [16])0x0;
      local_e18 = (undefined1  [16])0x0;
      local_e08[0] = 0;
      local_e08[1] = 0;
      stack0xfffffffffffff200 = 0;
      uStack_dfb = 0;
      iStack_df8 = 0;
      abStack_df4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_e68,*(double *)(in_FS_OFFSET + -8));
      pcVar13 = local_da0;
      if ((((this->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          ((fpclass_type)local_df0 != cpp_dec_float_NaN)) &&
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_da0,(cpp_dec_float<200U,_int,_void> *)local_e68), iVar11 < 0)) {
        iVar11 = this->m_j;
        pnVar7 = (pVVar28->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar21 = pcVar13;
        pnVar18 = pnVar7 + iVar11;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar30 * -8 + 4);
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        pnVar7[iVar11].m_backend.exp = (this->m_upper).m_backend.exp;
        pnVar7[iVar11].m_backend.neg = (this->m_upper).m_backend.neg;
        iVar9 = (this->m_upper).m_backend.prec_elem;
        pnVar7[iVar11].m_backend.fpclass = (this->m_upper).m_backend.fpclass;
        pnVar7[iVar11].m_backend.prec_elem = iVar9;
        VVar27 = ON_UPPER;
        if (((this->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
           (VVar27 = ON_UPPER, (this->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (local_db0,pcVar13);
          VVar27 = (uint)(iVar11 == 0) * 2;
        }
        break;
      }
    }
    ::soplex::infinity::__tls_init();
    local_dc8 = (cpp_dec_float<200U,_int,_void> *)((long)local_dc8 + 8);
    dVar4 = *(double *)(in_FS_OFFSET + -8);
    local_df0._0_4_ = cpp_dec_float_finite;
    local_df0._4_4_ = 0x1c;
    local_e68 = (undefined1  [16])0x0;
    local_e58 = (undefined1  [16])0x0;
    local_e48 = (undefined1  [16])0x0;
    local_e38 = (undefined1  [16])0x0;
    local_e28 = (undefined1  [16])0x0;
    local_e18 = (undefined1  [16])0x0;
    local_e08[0] = 0;
    local_e08[1] = 0;
    stack0xfffffffffffff200 = 0;
    uStack_dfb = 0;
    iStack_df8 = 0;
    abStack_df4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_e68,-dVar4);
    piVar17 = piVar14;
    if ((((fpclass_type)local_b10 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_df0 == cpp_dec_float_NaN)) ||
       (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_b88,
                            (cpp_dec_float<200U,_int,_void> *)local_e68), iVar11 < 1)) {
      ::soplex::infinity::__tls_init();
      local_df0._0_4_ = cpp_dec_float_finite;
      local_df0._4_4_ = 0x1c;
      local_e68 = (undefined1  [16])0x0;
      local_e58 = (undefined1  [16])0x0;
      local_e48 = (undefined1  [16])0x0;
      local_e38 = (undefined1  [16])0x0;
      local_e28 = (undefined1  [16])0x0;
      local_e18 = (undefined1  [16])0x0;
      local_e08[0] = 0;
      local_e08[1] = 0;
      stack0xfffffffffffff200 = 0;
      uStack_dfb = 0;
      iStack_df8 = 0;
      abStack_df4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_e68,dVar4);
      if ((((fpclass_type)local_b90 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_df0 == cpp_dec_float_NaN)) ||
         (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_c08,
                              (cpp_dec_float<200U,_int,_void> *)local_e68), -1 < iVar11)) {
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_e68._0_8_ = local_e58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e68,"XMAISM03 This should never happen.","");
        *puVar12 = &PTR__SPxException_006a9ee8;
        puVar12[1] = puVar12 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar12 + 1),local_e68._0_8_,
                   (undefined1 *)(local_e68._0_8_ + local_e68._8_8_));
        *puVar12 = &PTR__SPxException_006a9ec0;
        __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      iVar11 = *piVar1;
      pnVar7 = (pVVar28->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar22 = (undefined4 *)local_c08;
      pnVar18 = pnVar7 + iVar11;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = *puVar22;
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar7[iVar11].m_backend.exp = iStack_b98;
      pnVar7[iVar11].m_backend.neg = bStack_b94;
      pnVar7[iVar11].m_backend.fpclass = (fpclass_type)local_b90;
      pnVar7[iVar11].m_backend.prec_elem = local_b90._4_4_;
      cStatus->data[*piVar1] = BASIC;
      VVar27 = ON_LOWER;
      pcVar13 = local_dc8;
      if (local_d08.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e68,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d08,(cpp_dec_float<200U,_int,_void> *)local_e68);
        VVar27 = (VarStatus)(iVar11 < 1);
        pcVar13 = local_dc8;
      }
    }
    else {
      iVar11 = *piVar1;
      pnVar7 = (pVVar28->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar22 = (undefined4 *)local_b88;
      pnVar18 = pnVar7 + iVar11;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = *puVar22;
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar7[iVar11].m_backend.exp = iStack_b18;
      pnVar7[iVar11].m_backend.neg = bStack_b14;
      pnVar7[iVar11].m_backend.fpclass = (fpclass_type)local_b10;
      pnVar7[iVar11].m_backend.prec_elem = local_b10._4_4_;
      cStatus->data[*piVar1] = BASIC;
      VVar27 = ON_UPPER;
      pcVar13 = local_dc8;
      if (local_d08.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)local_e68,0,(type *)0x0);
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_d08,(cpp_dec_float<200U,_int,_void> *)local_e68);
        VVar27 = (VarStatus)(0 < iVar11);
        pcVar13 = local_dc8;
      }
    }
    goto LAB_005874f9;
  }
  piVar14 = piVar1;
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)&cStatus->data;
LAB_005874f9:
  (*(VarStatus **)pcVar13)[*piVar14] = VVar27;
  pcVar21 = &(pVVar28->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar1].m_backend;
  local_df0._0_4_ = cpp_dec_float_finite;
  local_df0._4_4_ = 0x1c;
  local_e68 = (undefined1  [16])0x0;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08[0] = 0;
  local_e08[1] = 0;
  stack0xfffffffffffff200 = 0;
  uStack_dfb = 0;
  iStack_df8 = 0;
  abStack_df4[0] = false;
  pcVar13 = &local_d08;
  if ((cpp_dec_float<200U,_int,_void> *)local_e68 != pcVar21) {
    pcVar13 = &local_d08;
    pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_e68;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar25->data)->data)._M_elems[0] =
           (pcVar13->data)._M_elems[0];
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar30 * -2 + 1) * 4);
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar30 * -8 + 4);
    }
    iStack_df8 = local_d08.exp;
    abStack_df4[0] = local_d08.neg;
    local_df0._4_4_ = local_d08.prec_elem;
    local_df0._0_4_ = local_d08.fpclass;
    pcVar13 = pcVar21;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_e68,pcVar13);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(local_de8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[*piVar17].m_backend,
             (cpp_dec_float<200U,_int,_void> *)local_e68);
  local_d20._0_4_ = cpp_dec_float_finite;
  local_d20._4_4_ = 0x1c;
  local_d98._0_16_ = (undefined1  [16])0x0;
  local_d98._16_16_ = (undefined1  [16])0x0;
  local_d78 = (undefined1  [16])0x0;
  local_d68 = (undefined1  [16])0x0;
  local_d58 = (undefined1  [16])0x0;
  local_d48 = (undefined1  [16])0x0;
  local_d38 = SUB1613((undefined1  [16])0x0,0);
  uStack_d2b = 0;
  iStack_d28 = 0;
  abStack_d24[0] = false;
  local_df0._0_4_ = cpp_dec_float_finite;
  local_df0._4_4_ = 0x1c;
  local_e68 = (undefined1  [16])0x0;
  local_e58 = (undefined1  [16])0x0;
  local_e48 = (undefined1  [16])0x0;
  local_e38 = (undefined1  [16])0x0;
  local_e28 = (undefined1  [16])0x0;
  local_e18 = (undefined1  [16])0x0;
  local_e08[0] = 0;
  local_e08[1] = 0;
  stack0xfffffffffffff200 = 0;
  uStack_dfb = 0;
  iStack_df8 = 0;
  abStack_df4[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_e68,-1.0);
  pcVar13 = &local_d08;
  pcVar21 = (cpp_dec_float<200U,_int,_void> *)local_d98;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar21->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar30 * -2 + 1) * 4);
    pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar30 * -8 + 4);
  }
  iStack_d28 = local_d08.exp;
  abStack_d24[0] = local_d08.neg;
  local_d20._4_4_ = local_d08.prec_elem;
  local_d20._0_4_ = local_d08.fpclass;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_d98,(cpp_dec_float<200U,_int,_void> *)local_e68
            );
  pVVar28 = local_d18;
  pcVar21 = &(local_d10->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar17].m_backend;
  local_df0._0_4_ = cpp_dec_float_finite;
  local_df0._4_4_ = 0x1c;
  local_e68 = ZEXT816(0);
  local_e58 = ZEXT816(0);
  local_e48 = ZEXT816(0);
  local_e38 = ZEXT816(0);
  local_e28 = ZEXT816(0);
  local_e18 = ZEXT816(0);
  local_e08[0] = 0;
  local_e08[1] = 0;
  stack0xfffffffffffff200 = 0;
  uStack_dfb = 0;
  iStack_df8 = 0;
  abStack_df4[0] = false;
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_d98;
  if ((cpp_dec_float<200U,_int,_void> *)local_e68 != pcVar21) {
    puVar22 = (undefined4 *)local_d98;
    puVar26 = (undefined4 *)local_e68;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar26 = *puVar22;
      puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
      puVar26 = puVar26 + (ulong)bVar30 * -2 + 1;
    }
    iStack_df8 = iStack_d28;
    abStack_df4[0] = abStack_d24[0];
    local_df0 = local_d20;
    pcVar13 = pcVar21;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_e68,pcVar13);
  iVar11 = *piVar1;
  pnVar7 = (pVVar28->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_e68;
  pnVar18 = pnVar7 + iVar11;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pnVar18->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar30 * -8 + 4);
    pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
  }
  pnVar7[iVar11].m_backend.exp = iStack_df8;
  pnVar7[iVar11].m_backend.neg = abStack_df4[0];
  pnVar7[iVar11].m_backend.fpclass = (fpclass_type)local_df0;
  pnVar7[iVar11].m_backend.prec_elem = local_df0._4_4_;
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}